

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.hpp
# Opt level: O3

void __thiscall
websocketpp::http::parser::response::process(response *this,iterator begin,iterator end)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  long *plVar4;
  exception *peVar5;
  int code;
  istringstream ss;
  string local_218;
  value local_1f4;
  string local_1f0;
  string local_1d0;
  string local_1b0 [3];
  ios_base local_138 [264];
  
  local_1b0[0]._M_dataplus._M_p._0_1_ = 0x20;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (begin._M_current,end._M_current);
  if (_Var2._M_current == end._M_current) {
    peVar5 = (exception *)__cxa_allocate_exception(0x70);
    local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Invalid response line","");
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    local_218._M_string_length = 0;
    local_218.field_2._M_local_buf[0] = '\0';
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    local_1f0._M_string_length = 0;
    local_1f0.field_2._M_local_buf[0] = '\0';
    exception::exception(peVar5,local_1b0,bad_request,&local_218,&local_1f0);
    __cxa_throw(peVar5,&exception::typeinfo,exception::~exception);
  }
  paVar1 = &local_1b0[0].field_2;
  local_1b0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)local_1b0,begin._M_current,_Var2._M_current);
  std::__cxx11::string::_M_assign((string *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0[0]._M_dataplus._M_p,local_1b0[0].field_2._M_allocated_capacity + 1);
  }
  local_1b0[0]._M_dataplus._M_p._0_1_ = 0x20;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (_Var2._M_current + 1,end._M_current);
  if (_Var3._M_current != end._M_current) {
    paVar1 = &local_218.field_2;
    local_218._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_218,_Var2._M_current + 1,_Var3._M_current);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b0,(string *)&local_218,_S_in);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar1) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                               local_218.field_2._M_local_buf[0]) + 1);
    }
    plVar4 = (long *)std::istream::operator>>(local_1b0,(int *)&local_1f4);
    if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
      local_218._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)&local_218,_Var3._M_current + 1,end._M_current);
      this->m_status_code = local_1f4;
      std::__cxx11::string::_M_assign((string *)&this->m_status_msg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar1) {
        operator_delete(local_218._M_dataplus._M_p,
                        CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                 local_218.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
      std::ios_base::~ios_base(local_138);
      return;
    }
    peVar5 = (exception *)__cxa_allocate_exception(0x70);
    local_218._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,"Unable to parse response code","");
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    local_1f0._M_string_length = 0;
    local_1f0.field_2._M_local_buf[0] = '\0';
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    local_1d0._M_string_length = 0;
    local_1d0.field_2._M_local_buf[0] = '\0';
    exception::exception(peVar5,&local_218,bad_request,&local_1f0,&local_1d0);
    __cxa_throw(peVar5,&exception::typeinfo,exception::~exception);
  }
  peVar5 = (exception *)__cxa_allocate_exception(0x70);
  local_1b0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Invalid request line","");
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  exception::exception(peVar5,local_1b0,bad_request,&local_218,&local_1f0);
  __cxa_throw(peVar5,&exception::typeinfo,exception::~exception);
}

Assistant:

inline void response::process(std::string::iterator begin,
    std::string::iterator end)
{
    std::string::iterator cursor_start = begin;
    std::string::iterator cursor_end = std::find(begin,end,' ');

    if (cursor_end == end) {
        throw exception("Invalid response line",status_code::bad_request);
    }

    set_version(std::string(cursor_start,cursor_end));

    cursor_start = cursor_end+1;
    cursor_end = std::find(cursor_start,end,' ');

    if (cursor_end == end) {
        throw exception("Invalid request line",status_code::bad_request);
    }

    int code;

    std::istringstream ss(std::string(cursor_start,cursor_end));

    if ((ss >> code).fail()) {
        throw exception("Unable to parse response code",status_code::bad_request);
    }

    set_status(status_code::value(code),std::string(cursor_end+1,end));
}